

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

StandardIcon helperIcon(Icon i)

{
  Icon i_local;
  StandardIcon local_4;
  
  switch(i) {
  case NoIcon:
    local_4 = NoIcon;
    break;
  case Information:
    local_4 = Information;
    break;
  case Warning:
    local_4 = Warning;
    break;
  case Critical:
    local_4 = Critical;
    break;
  case Question:
    local_4 = Question;
    break;
  default:
    local_4 = NoIcon;
  }
  return local_4;
}

Assistant:

static QMessageDialogOptions::StandardIcon helperIcon(QMessageBox::Icon i)
{
    switch (i) {
    case QMessageBox::NoIcon:
        return QMessageDialogOptions::NoIcon;
    case QMessageBox::Information:
        return QMessageDialogOptions::Information;
    case QMessageBox::Warning:
        return QMessageDialogOptions::Warning;
    case QMessageBox::Critical:
        return QMessageDialogOptions::Critical;
    case QMessageBox::Question:
        return QMessageDialogOptions::Question;
    }
    return QMessageDialogOptions::NoIcon;
}